

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::with_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args,
          unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_1)

{
  expression *peVar1;
  element_type *this_00;
  undefined8 *puVar2;
  statement_ptr *in_RCX;
  source_extend local_40;
  
  peVar1 = args[0xe]._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar1 != (expression *)0x0) {
    this_00 = (element_type *)operator_new(0x30);
    puVar2 = (peVar1->super_syntax_node)._vptr_syntax_node;
    local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar2;
    local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
    if (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        puVar2 = (peVar1->super_syntax_node)._vptr_syntax_node;
      }
      else {
        (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_40.start = *(uint32_t *)((long)&(peVar1->super_syntax_node).extend_ + 0x10);
    local_40.end = *(uint32_t *)((long)puVar2 + 100);
    with_statement::with_statement
              ((with_statement *)this_00,&local_40,(expression_ptr *)args_1,in_RCX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_00;
    if (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::with_statement, Args = <std::unique_ptr<mjs::expression>, std::unique_ptr<mjs::statement>>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }